

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O2

int CBB_finish(CBB *cbb,uint8_t **out_data,size_t *out_len)

{
  int iVar1;
  
  if (cbb->is_child != '\0') {
    ERR_put_error(0xe,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                  ,0x7e);
    return 0;
  }
  iVar1 = CBB_flush(cbb);
  if (iVar1 == 0) {
    return 0;
  }
  if ((*(byte *)((long)&cbb->u + 0x18) & 1) == 0) {
    if (out_data == (uint8_t **)0x0) goto LAB_002412ca;
  }
  else if (out_len == (size_t *)0x0 || out_data == (uint8_t **)0x0) {
    return 0;
  }
  *out_data = (cbb->u).base.buf;
LAB_002412ca:
  if (out_len != (size_t *)0x0) {
    *out_len = (cbb->u).base.len;
  }
  (cbb->u).base.buf = (uint8_t *)0x0;
  CBB_cleanup(cbb);
  return 1;
}

Assistant:

int CBB_finish(CBB *cbb, uint8_t **out_data, size_t *out_len) {
  if (cbb->is_child) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  if (!CBB_flush(cbb)) {
    return 0;
  }

  if (cbb->u.base.can_resize && (out_data == NULL || out_len == NULL)) {
    // |out_data| and |out_len| can only be NULL if the CBB is fixed.
    return 0;
  }

  if (out_data != NULL) {
    *out_data = cbb->u.base.buf;
  }
  if (out_len != NULL) {
    *out_len = cbb->u.base.len;
  }
  cbb->u.base.buf = NULL;
  CBB_cleanup(cbb);
  return 1;
}